

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O0

RowVector __thiscall
rek::Solver::solve(Solver *this,Matrix<double,__1,__1,_0,__1,__1> *AColMajor,
                  Matrix<double,__1,__1,_1,__1,__1> *ARowMajor,RowVector *b,long maxIterations,
                  double tolerance)

{
  bool bVar1;
  Index IVar2;
  Index IVar3;
  Scalar *pSVar4;
  CoeffReturnType pdVar5;
  Index extraout_RDX;
  long in_R9;
  RealScalar RVar6;
  RealScalar RVar7;
  ReturnType RVar8;
  double dVar9;
  RowVector RVar10;
  RowXpr local_2f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
  local_2b8;
  RowXpr local_258;
  ColXpr local_220;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_1e8;
  ColXpr local_188;
  double local_150;
  double val;
  long j_k;
  long i_k;
  long k;
  long local_f8;
  long j;
  long local_b8;
  long i;
  undefined1 local_a8 [8];
  RowVector columnNorms;
  undefined1 local_90 [8];
  RowVector rowNorms;
  undefined1 local_70 [8];
  RowVector z;
  long n;
  long m;
  double tolerance_local;
  long maxIterations_local;
  RowVector *b_local;
  Matrix<double,__1,__1,_1,__1,__1> *ARowMajor_local;
  Matrix<double,__1,__1,_0,__1,__1> *AColMajor_local;
  Solver *this_local;
  RowVector *x;
  
  IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)b);
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ARowMajor);
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                 ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ARowMajor);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,
             &z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_70,
             (Matrix<double,__1,_1,_0,__1,_1> *)maxIterations);
  columnNorms.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                 ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ARowMajor);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_90,
             &columnNorms.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  i = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ARowMajor);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_a8,&i);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  for (local_b8 = 0; local_b8 < IVar2; local_b8 = local_b8 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
              ((RowXpr *)&j,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)b,local_b8);
    RVar6 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>
            ::squaredNorm((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                           *)&j);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_90,
                        local_b8);
    *pSVar4 = RVar6;
  }
  for (local_f8 = 0; local_f8 < IVar3; local_f8 = local_f8 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((ColXpr *)&k,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ARowMajor,
               local_f8);
    RVar7 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
            ::squaredNorm((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                           *)&k);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_a8,
                        local_f8);
    *pSVar4 = RVar7;
  }
  i_k = 0;
  while ((i_k < in_R9 &&
         (((i_k + 1) %
           (long)*(int *)&(AColMajor->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_data != 0 ||
          (bVar1 = hasConvergedDense((Solver *)AColMajor,(Matrix<double,__1,__1,_1,__1,__1> *)b,
                                     (Matrix<double,__1,__1,_0,__1,__1> *)ARowMajor,
                                     (RowVector *)this,(RowVector *)maxIterations,
                                     (RowVector *)local_70,tolerance), !bVar1))))) {
    j_k = i_k % IVar2;
    val = (double)(i_k % IVar3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_188,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ARowMajor,
               (Index)val);
    RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            dot<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                      ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_70,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                        *)&local_188);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_a8,
                        (Index)val);
    local_150 = -RVar8 / *pSVar4;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_220,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ARowMajor,
               (Index)val);
    Eigen::operator*(&local_1e8,&local_150,(StorageBaseType *)&local_220);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_70,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_1e8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
              (&local_258,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)b,j_k);
    local_150 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                dot<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>>
                          ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                            *)&local_258);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)maxIterations,
                        j_k);
    dVar9 = *pdVar5;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_70,j_k);
    dVar9 = (dVar9 - *pSVar4) - local_150;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_90,j_k);
    local_150 = dVar9 / *pSVar4;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
              (&local_2f0,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)b,j_k);
    Eigen::operator*(&local_2b8,&local_150,(StorageBaseType *)&local_2f0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                *)&local_2b8);
    i_k = i_k + 1;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_90);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_70);
  RVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  RVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (RowVector)RVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

RowVector solve(Matrix<double, Dynamic, Dynamic, ColMajor> &AColMajor,
                  Matrix<double, Dynamic, Dynamic, RowMajor> &ARowMajor,
                  const RowVector &b, long maxIterations,
                  double tolerance = tolerance_) const {
    const long m = ARowMajor.rows(), n = AColMajor.cols();
    RowVector x(AColMajor.cols());
    RowVector z(b);
    RowVector rowNorms(AColMajor.rows());
    RowVector columnNorms(AColMajor.cols());

    x.setZero();

    for (long i = 0; i < m; i++) {
      rowNorms(i) = ARowMajor.row(i).squaredNorm();
    }

    for (long j = 0; j < n; j++) {
      columnNorms(j) = AColMajor.col(j).squaredNorm();
    }

    for (long k = 0; k < maxIterations; k++) {
      // Check for convergence every blockSize_ iterations
      if ((k + 1) % blockSize_ == 0 &&
          hasConvergedDense(ARowMajor, AColMajor, x, b, z, tolerance)) {
        break;
      }

      // Extended Kaczmarz
      const long i_k = k % m;
      const long j_k = k % n;

      double val = -z.dot(AColMajor.col(j_k)) / columnNorms(j_k);
      z += val * AColMajor.col(j_k);
      val = x.dot(ARowMajor.row(i_k));
      val = (b(i_k) - z(i_k) - val) / rowNorms(i_k);

      x += val * ARowMajor.row(i_k);
    }
    return x;
  }